

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_20.cpp
# Opt level: O0

void __thiscall FRenderState::DrawColormapOverlay(FRenderState *this)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  FSpecialColormap *pFVar4;
  int flicker;
  float m [4];
  FSpecialColormap *scm;
  float local_18;
  float b;
  float g;
  float r;
  FRenderState *this_local;
  
  if ((this->mColormapState < 1) ||
     (iVar1 = this->mColormapState,
     uVar3 = TArray<FSpecialColormap,_FSpecialColormap>::Size(&SpecialColormaps),
     (int)(uVar3 + 1) <= iVar1)) {
    if (this->mColormapState == 0x20000000) {
      bVar2 = FBoolCVar::operator_cast_to_bool(&gl_enhanced_nightvision);
      if (!bVar2) {
        return;
      }
      b = 0.375;
      local_18 = 1.0;
      scm._4_4_ = 0.375;
    }
    else {
      if (this->mColormapState < 0x20000010) {
        return;
      }
      b = (float)(7 - (this->mColormapState + -0x20000010)) / 70.0 + 0.8;
      if (1.0 < b) {
        b = 1.0;
      }
      local_18 = b;
      scm._4_4_ = b;
      bVar2 = FBoolCVar::operator_cast_to_bool(&gl_enhanced_nightvision);
      if (bVar2) {
        scm._4_4_ = b * 0.75;
      }
    }
  }
  else {
    pFVar4 = TArray<FSpecialColormap,_FSpecialColormap>::operator[]
                       (&SpecialColormaps,(ulong)(gl_fixedcolormap - 1));
    if (((0.0 <= pFVar4->ColorizeEnd[0] - pFVar4->ColorizeStart[0]) ||
        (0.0 <= pFVar4->ColorizeEnd[1] - pFVar4->ColorizeStart[1])) ||
       (0.0 <= pFVar4->ColorizeEnd[2] - pFVar4->ColorizeStart[2])) {
      b = pFVar4->ColorizeEnd[0];
      local_18 = pFVar4->ColorizeEnd[1];
      scm._4_4_ = pFVar4->ColorizeEnd[2];
    }
    else {
      SetColor(&gl_RenderState,1.0,1.0,1.0,1.0,0);
      BlendFunc(&gl_RenderState,0x307,0);
      gl_FillScreen();
      b = pFVar4->ColorizeStart[0];
      local_18 = pFVar4->ColorizeStart[1];
      scm._4_4_ = pFVar4->ColorizeStart[2];
    }
  }
  SetColor(&gl_RenderState,b,local_18,scm._4_4_,1.0,0);
  BlendFunc(&gl_RenderState,0x306,0);
  gl_FillScreen();
  BlendFunc(&gl_RenderState,0x302,0x303);
  return;
}

Assistant:

void FRenderState::DrawColormapOverlay()
{
	float r, g, b;
	if (mColormapState > CM_DEFAULT && mColormapState < CM_MAXCOLORMAP)
	{
		FSpecialColormap *scm = &SpecialColormaps[gl_fixedcolormap - CM_FIRSTSPECIALCOLORMAP];
		float m[] = { scm->ColorizeEnd[0] - scm->ColorizeStart[0],
			scm->ColorizeEnd[1] - scm->ColorizeStart[1], scm->ColorizeEnd[2] - scm->ColorizeStart[2], 0.f };

		if (m[0] < 0 && m[1] < 0 && m[2] < 0)
		{
			gl_RenderState.SetColor(1, 1, 1, 1);
			gl_RenderState.BlendFunc(GL_ONE_MINUS_DST_COLOR, GL_ZERO);
			gl_FillScreen();

			r = scm->ColorizeStart[0];
			g = scm->ColorizeStart[1];
			b = scm->ColorizeStart[2];
		}
		else
		{
			r = scm->ColorizeEnd[0];
			g = scm->ColorizeEnd[1];
			b = scm->ColorizeEnd[2];
		}
	}
	else if (mColormapState == CM_LITE)
	{
		if (gl_enhanced_nightvision)
		{
			r = 0.375f, g = 1.0f, b = 0.375f;
		}
		else
		{
			return;
		}
	}
	else if (mColormapState >= CM_TORCH)
	{
		int flicker = mColormapState - CM_TORCH;
		r = (0.8f + (7 - flicker) / 70.0f);
		if (r > 1.0f) r = 1.0f;
		b = g = r;
		if (gl_enhanced_nightvision) b = g * 0.75f;
	}
	else return;

	gl_RenderState.SetColor(r, g, b, 1.f);
	gl_RenderState.BlendFunc(GL_DST_COLOR, GL_ZERO);
	gl_FillScreen();
	gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
}